

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tzfmt.cpp
# Opt level: O0

int32_t icu_63::TimeZoneFormat::parseAsciiOffsetFields
                  (UnicodeString *text,ParsePosition *pos,UChar sep,OffsetFields minFields,
                  OffsetFields maxFields)

{
  char16_t cVar1;
  int32_t ei;
  int32_t iVar2;
  int local_70;
  int local_64;
  int local_60;
  int32_t parsedFields;
  int32_t parsedLen;
  int32_t offset;
  int32_t digit;
  int32_t iStack_4c;
  UChar c;
  int32_t fieldIdx;
  int32_t idx;
  int32_t fieldLen [3];
  int32_t fieldVal [3];
  int32_t start;
  OffsetFields maxFields_local;
  OffsetFields minFields_local;
  UChar sep_local;
  ParsePosition *pos_local;
  UnicodeString *text_local;
  
  ei = ParsePosition::getIndex(pos);
  memset(fieldLen + 1,0,0xc);
  _fieldIdx = 0xffffffff00000000;
  fieldLen[0] = -1;
  digit = 0;
  for (iStack_4c = ei; iVar2 = UnicodeString::length(text),
      iStack_4c < iVar2 && digit <= (int)maxFields; iStack_4c = iStack_4c + 1) {
    cVar1 = UnicodeString::charAt(text,iStack_4c);
    if (cVar1 == sep) {
      if (digit == 0) {
        if (fieldIdx == 0) break;
      }
      else {
        if ((&fieldIdx)[digit] != -1) break;
        (&fieldIdx)[digit] = 0;
      }
    }
    else {
      if ((&fieldIdx)[digit] == -1) break;
      if (((ushort)cVar1 < 0x30) || (0x39 < (ushort)cVar1)) {
        local_70 = -1;
      }
      else {
        local_70 = (ushort)cVar1 - 0x30;
      }
      if (local_70 < 0) break;
      fieldLen[(long)digit + 1] = fieldLen[(long)digit + 1] * 10 + local_70;
      (&fieldIdx)[digit] = (&fieldIdx)[digit] + 1;
      if (1 < (&fieldIdx)[digit]) {
        digit = digit + 1;
      }
    }
  }
  parsedFields = 0;
  local_60 = 0;
  local_64 = -1;
  if (fieldIdx != 0) {
    if (fieldLen[1] < 0x18) {
      parsedFields = fieldLen[1] * 3600000;
      local_60 = fieldIdx;
      local_64 = 0;
      if ((idx == 2) && (fieldLen[2] < 0x3c)) {
        parsedFields = fieldLen[2] * 60000 + parsedFields;
        local_60 = fieldIdx + 3;
        local_64 = 1;
        if ((fieldLen[0] == 2) && (fieldVal[0] < 0x3c)) {
          parsedFields = fieldVal[0] * 1000 + parsedFields;
          local_60 = fieldIdx + 6;
          local_64 = 2;
        }
      }
    }
    else {
      parsedFields = (fieldLen[1] / 10) * 3600000;
      local_64 = 0;
      local_60 = 1;
    }
  }
  if (local_64 < (int)minFields) {
    ParsePosition::setErrorIndex(pos,ei);
    text_local._4_4_ = 0;
  }
  else {
    ParsePosition::setIndex(pos,ei + local_60);
    text_local._4_4_ = parsedFields;
  }
  return text_local._4_4_;
}

Assistant:

int32_t
TimeZoneFormat::parseAsciiOffsetFields(const UnicodeString& text, ParsePosition& pos, UChar sep, OffsetFields minFields, OffsetFields maxFields) {
    int32_t start = pos.getIndex();
    int32_t fieldVal[] = {0, 0, 0};
    int32_t fieldLen[] = {0, -1, -1};
    for (int32_t idx = start, fieldIdx = 0; idx < text.length() && fieldIdx <= maxFields; idx++) {
        UChar c = text.charAt(idx);
        if (c == sep) {
            if (fieldIdx == 0) {
                if (fieldLen[0] == 0) {
                    // no hours field
                    break;
                }
                // 1 digit hour, move to next field
            } else {
                if (fieldLen[fieldIdx] != -1) {
                    // premature minute or seconds field
                    break;
                }
                fieldLen[fieldIdx] = 0;
            }
            continue;
        } else if (fieldLen[fieldIdx] == -1) {
            // no separator after 2 digit field
            break;
        }
        int32_t digit = DIGIT_VAL(c);
        if (digit < 0) {
            // not a digit
            break;
        }
        fieldVal[fieldIdx] = fieldVal[fieldIdx] * 10 + digit;
        fieldLen[fieldIdx]++;
        if (fieldLen[fieldIdx] >= 2) {
            // parsed 2 digits, move to next field
            fieldIdx++;
        }
    }

    int32_t offset = 0;
    int32_t parsedLen = 0;
    int32_t parsedFields = -1;
    do {
        // hour
        if (fieldLen[0] == 0) {
            break;
        }
        if (fieldVal[0] > MAX_OFFSET_HOUR) {
            offset = (fieldVal[0] / 10) * MILLIS_PER_HOUR;
            parsedFields = FIELDS_H;
            parsedLen = 1;
            break;
        }
        offset = fieldVal[0] * MILLIS_PER_HOUR;
        parsedLen = fieldLen[0];
        parsedFields = FIELDS_H;

        // minute
        if (fieldLen[1] != 2 || fieldVal[1] > MAX_OFFSET_MINUTE) {
            break;
        }
        offset += fieldVal[1] * MILLIS_PER_MINUTE;
        parsedLen += (1 + fieldLen[1]);
        parsedFields = FIELDS_HM;

        // second
        if (fieldLen[2] != 2 || fieldVal[2] > MAX_OFFSET_SECOND) {
            break;
        }
        offset += fieldVal[2] * MILLIS_PER_SECOND;
        parsedLen += (1 + fieldLen[2]);
        parsedFields = FIELDS_HMS;
    } while (false);

    if (parsedFields < minFields) {
        pos.setErrorIndex(start);
        return 0;
    }

    pos.setIndex(start + parsedLen);
    return offset;
}